

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prop_down.h
# Opt level: O1

void __thiscall
mp::
ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::PropagateResult(ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                  *this,NotConstraint *con,double lb,double ub,Context ctx)

{
  int var;
  double lb_00;
  double ub_00;
  
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::NarrowVarBounds((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                     *)this,(con->super_FunctionalConstraint).result_var_,lb,ub);
  Context::Add(&(con->super_FunctionalConstraint).ctx,ctx);
  if ((lb == ub) && (!NAN(lb) && !NAN(ub))) {
    lb_00 = 0.0;
    if ((lb != 0.0) || (NAN(lb))) {
      if ((CTX_MIX < ctx.value_) || ((0x16U >> (ctx.value_ & 0x1f) & 1) == 0)) goto LAB_003723bb;
      var = (con->super_CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NotId>)
            .args_._M_elems[0];
      if (ctx.value_ < CTX_MIX) {
        ctx.value_ = *(CtxVal *)(&DAT_0049c4d0 + (ulong)ctx.value_ * 4);
      }
      ub_00 = 0.0;
    }
    else {
      if (1 < ctx.value_ - CTX_NEG) goto LAB_003723bb;
      var = (con->super_CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NotId>)
            .args_._M_elems[0];
      if (ctx.value_ < CTX_MIX) {
        ctx.value_ = *(CtxVal *)(&DAT_0049c4d0 + (ulong)ctx.value_ * 4);
      }
      lb_00 = 1.0;
      ub_00 = 1.0;
    }
    FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::PropagateResultOfInitExpr
              ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                *)this,var,lb_00,ub_00,ctx);
    FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::DecrementVarUsage((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                         *)this,(con->super_FunctionalConstraint).result_var_);
    return;
  }
LAB_003723bb:
  if (ctx.value_ < CTX_MIX) {
    ctx.value_ = *(CtxVal *)(&DAT_0049c4d0 + (ulong)ctx.value_ * 4);
  }
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::PropagateResultOfInitExpr
            ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              *)this,(con->
                     super_CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NotId>
                     ).args_._M_elems[0],0.0,1.0,ctx);
  return;
}

Assistant:

void PropagateResult(NotConstraint& con, double lb, double ub, Context ctx) {
    MPD( NarrowVarBounds(con.GetResultVar(), lb, ub) );
    con.AddContext(ctx);
    if (lb==ub) {                         // result fixed
      if (!lb && ctx.HasNegative()) {       // result==0 && ctx-
        MPD( PropagateResultOfInitExpr(con.GetArguments()[0], 1.0, 1.0, -ctx) );
        MPD( DecrementVarUsage(con.GetResultVar()) );
        return;
      } else if (lb && ctx.HasPositive()) { // result==1 && ctx+
        MPD( PropagateResultOfInitExpr(con.GetArguments()[0], 0.0, 0.0, -ctx) );
        MPD( DecrementVarUsage(con.GetResultVar()) );
        return;
      }
    }
    MPD( PropagateResultOfInitExpr(con.GetArguments()[0], 0.0, 1.0, -ctx) );
  }